

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crange.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CRange::process(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *__return_storage_ptr__,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *commands,short sswitch,
                 vector<CRange::Tdata,_std::allocator<CRange::Tdata>_> *targets)

{
  bool bVar1;
  byte bVar2;
  size_type sVar3;
  reference pbVar4;
  istream *piVar5;
  string *__lhs;
  ostream *poVar6;
  void *this;
  value_type local_478 [36];
  int local_454;
  undefined1 local_450 [8];
  Tdata target;
  double out;
  double a1;
  double z1;
  double red2;
  double red1;
  string targname;
  string local_380 [8];
  string task;
  ostringstream local_360 [8];
  ostringstream r;
  istringstream local_1d8 [8];
  istringstream c;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  iterator it;
  vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_> rt;
  vector<CRange::Tdata,_std::allocator<CRange::Tdata>_> *targets_local;
  short sswitch_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *results;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(commands);
  if (sVar3 != 0) {
    std::vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_>::vector
              ((vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_> *)&it);
    local_50._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(commands);
    while( true ) {
      local_58._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(commands);
      bVar1 = __gnu_cxx::operator!=(&local_50,&local_58);
      if (!bVar1) break;
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_50);
      std::__cxx11::istringstream::istringstream(local_1d8,pbVar4,8);
      std::__cxx11::ostringstream::ostringstream(local_360);
      std::__cxx11::string::string(local_380);
      std::__cxx11::string::string((string *)&red1);
      target._hash = -9999.0;
      piVar5 = std::operator>>((istream *)local_1d8,local_380);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&red2);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&z1);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&a1);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&out);
      std::operator>>(piVar5,(string *)&red1);
      bVar2 = std::ios::eof();
      if ((bVar2 & 1) == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Invalid command detected: ");
        pbVar4 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_50);
        poVar6 = std::operator<<(poVar6,(string *)pbVar4);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      else {
        find_target((Tdata *)local_450,(string *)&red1,targets);
        __lhs = Tdata::name_abi_cxx11_((Tdata *)local_450);
        bVar1 = std::operator==(__lhs,"Unknown");
        if (bVar1) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"Invalid target detected in command: ");
          pbVar4 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_50);
          poVar6 = std::operator<<(poVar6,(string *)pbVar4);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_380,"r");
          if (bVar1) {
            target._hash = range(red2,a1,out,sswitch,(Tdata *)local_450,
                                 (vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_> *)
                                 &it);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_380,"e");
            if (bVar1) {
              target._hash = renergy(red2,z1,a1,out,sswitch,(Tdata *)local_450,
                                     (vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_>
                                      *)&it);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_380,"d");
              if (bVar1) {
                target._hash = dedx(red2,z1,a1,out,sswitch,(Tdata *)local_450);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_380,"j");
                if (bVar1) {
                  target._hash = djdx(red2,a1,2.0,0.05,3.04,sswitch,(Tdata *)local_450);
                }
                else {
                  poVar6 = std::operator<<((ostream *)&std::cerr,
                                           "Invalid task detected in command: ");
                  pbVar4 = __gnu_cxx::
                           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&local_50);
                  poVar6 = std::operator<<(poVar6,(string *)pbVar4);
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                }
              }
            }
          }
        }
        Tdata::~Tdata((Tdata *)local_450);
      }
      local_454 = (int)std::setprecision(6);
      poVar6 = std::operator<<((ostream *)local_360,(_Setprecision)local_454);
      this = (void *)std::ostream::operator<<(poVar6,std::fixed);
      std::ostream::operator<<(this,target._hash);
      std::__cxx11::ostringstream::str();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,local_478);
      std::__cxx11::string::~string((string *)local_478);
      std::__cxx11::string::~string((string *)&red1);
      std::__cxx11::string::~string(local_380);
      std::__cxx11::ostringstream::~ostringstream(local_360);
      std::__cxx11::istringstream::~istringstream(local_1d8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_50);
    }
    std::vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_>::~vector
              ((vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_> *)&it);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> CRange::process( std::vector<std::string> &commands, short sswitch, std::vector<CRange::Tdata> &targets )
{
    std::vector<std::string> results;
    if (commands.size() == 0) return results;
    std::vector<CRange::RangeTable> rt;
    for (std::vector<std::string>::iterator it=commands.begin(); it != commands.end(); ++it) {
        std::istringstream c(*it);
        std::ostringstream r;
        std::string task, targname;
        double red1, red2, z1, a1;
        double out = -9999.0;
        c >> task >> red1 >> red2 >> z1 >> a1 >> targname;
        //
        // c.good() will be false, even on a good read, because a good read
        // will also reach the end of input, so we test eof instead.
        //
        if (c.eof()) {
            CRange::Tdata target = CRange::find_target(targname, targets);
            if (target.name() == "Unknown") {
                std::cerr << "Invalid target detected in command: " << *it << std::endl;
            } else {
                if (task == "r") {
                    out = CRange::range(red1,z1,a1,sswitch,target,rt);
                } else if (task == "e") {
                    out = CRange::renergy(red1,red2,z1,a1,sswitch,target,rt);
                } else if (task == "d") {
                    out = CRange::dedx(red1,red2,z1,a1,sswitch,target);
                } else if (task == "j") {
                    out = CRange::djdx(red1, z1, 2.0, 0.05, 3.04, sswitch, target);
                } else {
                    std::cerr << "Invalid task detected in command: " << *it << std::endl;
                }
            }
        } else {
            std::cerr << "Invalid command detected: " << *it << std::endl;
        }
        r << std::setprecision(6) << std::fixed << out;
        // r << std::setprecision(5) << std::scientific << out;
        results.push_back(r.str());
    }
    return results;
}